

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O1

FT_Error TT_Load_Simple_Glyph(TT_Loader load)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  FT_GlyphLoader loader;
  byte *pbVar5;
  ushort *puVar6;
  FT_GlyphSlot pFVar7;
  TT_ExecContext pTVar8;
  FT_Byte *__dest;
  bool bVar9;
  ushort *puVar10;
  ushort uVar11;
  int iVar12;
  ushort *puVar13;
  FT_Vector *pFVar14;
  ulong uVar15;
  long lVar16;
  FT_UInt n_contours;
  ushort uVar17;
  FT_Vector *pFVar18;
  byte *__s;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  byte *pbVar22;
  int iVar23;
  byte *pbVar24;
  FT_Vector *pFVar25;
  FT_Error FVar26;
  FT_ULong tmp;
  ulong local_38;
  
  loader = load->gloader;
  pbVar24 = load->cursor;
  pbVar5 = load->limit;
  sVar4 = load->n_contours;
  n_contours = (FT_UInt)sVar4;
  iVar12 = 0;
  if ((sVar4 != 0) &&
     (iVar12 = 0,
     loader->max_contours <
     (int)(loader->base).outline.n_contours + n_contours + (int)(loader->current).outline.n_contours
     )) {
    iVar12 = FT_GlyphLoader_CheckPoints(loader,0,n_contours);
  }
  if (iVar12 != 0) {
    return iVar12;
  }
  if (0xffe < sVar4) {
    return 0x14;
  }
  if (pbVar5 < pbVar24 + (long)(int)n_contours * 2 + 2) {
    return 0x14;
  }
  puVar6 = (ushort *)(loader->current).outline.contours;
  bVar2 = *pbVar24;
  uVar11 = CONCAT11(bVar2,pbVar24[1]);
  if (0 < sVar4) {
    *puVar6 = uVar11;
  }
  if ((short)((ushort)bVar2 << 8) < 0) {
    return 0x14;
  }
  pbVar21 = pbVar24 + 4;
  pbVar24 = pbVar5 + (-4 - (long)pbVar24);
  puVar10 = puVar6;
  while (puVar13 = puVar10 + 1, puVar13 < puVar6 + (int)n_contours) {
    uVar17 = *(ushort *)(pbVar21 + -2) << 8 | *(ushort *)(pbVar21 + -2) >> 8;
    *puVar13 = uVar17;
    pbVar21 = pbVar21 + 2;
    pbVar24 = pbVar24 + -2;
    bVar9 = (short)uVar17 <= (short)uVar11;
    puVar10 = puVar13;
    uVar11 = uVar17;
    if (bVar9) {
      return 0x14;
    }
  }
  FVar26 = 0;
  uVar20 = 0;
  if (0 < sVar4) {
    if ((short)*puVar10 < -1) {
      return 0x14;
    }
    uVar20 = (ulong)((int)(short)*puVar10 + 1);
  }
  iVar12 = (int)uVar20;
  if (loader->max_points <
      (uint)((loader->base).outline.n_points + iVar12 + 4 + (int)(loader->current).outline.n_points)
     ) {
    FVar26 = FT_GlyphLoader_CheckPoints(loader,iVar12 + 4,0);
  }
  if (FVar26 != 0) {
    return FVar26;
  }
  pFVar7 = load->glyph;
  pFVar7->control_data = (void *)0x0;
  pFVar7->control_len = 0;
  if (pbVar21 <= pbVar5) {
    bVar2 = pbVar21[-2];
    bVar3 = pbVar21[-1];
    if ((load->load_flags & 2) == 0) {
      uVar11 = CONCAT11(bVar2,bVar3);
      uVar15 = (ulong)uVar11;
      if ((long)pbVar24 < (long)uVar15) {
        FVar26 = 0x16;
        iVar23 = 2;
      }
      else {
        pTVar8 = load->exec;
        local_38 = (ulong)pTVar8->glyphSize;
        FVar26 = Update_Max(pTVar8->memory,&local_38,1,&pTVar8->glyphIns,uVar15);
        pTVar8 = load->exec;
        pTVar8->glyphSize = (FT_UInt)local_38;
        if (FVar26 == 0) {
          pFVar7 = load->glyph;
          pFVar7->control_len = uVar15;
          __dest = pTVar8->glyphIns;
          pFVar7->control_data = __dest;
          iVar23 = 0;
          if (uVar11 != 0) {
            memcpy(__dest,pbVar21,uVar15);
          }
          FVar26 = 0;
        }
        else {
          iVar23 = 1;
        }
      }
      if (iVar23 == 2) {
        return FVar26;
      }
      if (iVar23 != 0) {
        return FVar26;
      }
    }
    else {
      FVar26 = 0;
    }
    pbVar21 = pbVar21 + ((uint)bVar3 + (uint)bVar2 * 0x100 & 0xffff);
    if (iVar12 != 0) {
      pbVar19 = (byte *)(loader->current).outline.tags;
      pbVar24 = pbVar19 + uVar20;
      pbVar22 = pbVar21;
      do {
        pbVar21 = pbVar22 + 1;
        if (pbVar5 < pbVar21) {
          return 0x14;
        }
        bVar2 = *pbVar22;
        __s = pbVar19 + 1;
        *pbVar19 = bVar2;
        if ((bVar2 & 8) != 0) {
          pbVar22 = pbVar22 + 2;
          if (pbVar5 < pbVar22) {
            return 0x14;
          }
          bVar3 = *pbVar21;
          uVar15 = (ulong)bVar3;
          if (pbVar24 < __s + uVar15) {
            return 0x14;
          }
          pbVar21 = pbVar22;
          if (uVar15 != 0) {
            memset(__s,(uint)bVar2,uVar15);
            __s = pbVar19 + (ulong)(bVar3 - 1 & 0xff) + 2;
          }
        }
        pbVar22 = pbVar21;
        pbVar19 = __s;
      } while (__s < pbVar24);
    }
    if ((iVar12 != 0) && ((*(loader->current).outline.tags & 0x40U) != 0)) {
      piVar1 = &(loader->base).outline.flags;
      *(byte *)piVar1 = (byte)*piVar1 | 0x40;
    }
    if (pbVar21 <= pbVar5) {
      pFVar14 = (loader->current).outline.points;
      pbVar24 = (byte *)(loader->current).outline.tags;
      pFVar25 = pFVar14 + uVar20;
      if (iVar12 != 0) {
        lVar16 = 0;
        pFVar18 = pFVar14;
        pbVar19 = pbVar24;
        do {
          bVar2 = *pbVar19;
          if ((bVar2 & 2) == 0) {
            if ((bVar2 & 0x10) == 0) {
              iVar23 = 3;
              if (pbVar5 < pbVar21 + 2) goto LAB_002613a9;
              pbVar22 = pbVar21 + 2;
              uVar15 = (long)(short)((ushort)*pbVar21 << 8) | (ulong)pbVar21[1];
            }
            else {
              pbVar22 = pbVar21;
              uVar15 = 0;
            }
LAB_0026139d:
            lVar16 = lVar16 + uVar15;
            pFVar18->x = lVar16;
            iVar23 = 0;
            pbVar21 = pbVar22;
          }
          else {
            pbVar22 = pbVar21 + 1;
            iVar23 = 3;
            if (pbVar22 <= pbVar5) {
              uVar15 = -(ulong)*pbVar21;
              if ((bVar2 & 0x10) != 0) {
                uVar15 = (ulong)*pbVar21;
              }
              goto LAB_0026139d;
            }
          }
LAB_002613a9:
          if (iVar23 != 0) goto joined_r0x00261479;
          pFVar18 = pFVar18 + 1;
          pbVar19 = pbVar19 + 1;
        } while (pFVar18 < pFVar25);
      }
      if (iVar12 != 0) {
        lVar16 = 0;
        do {
          bVar2 = *pbVar24;
          if ((bVar2 & 4) == 0) {
            if ((bVar2 & 0x20) == 0) {
              iVar23 = 3;
              if (pbVar5 < pbVar21 + 2) goto LAB_00261445;
              pbVar19 = pbVar21 + 2;
              uVar15 = (long)(short)((ushort)*pbVar21 << 8) | (ulong)pbVar21[1];
            }
            else {
              pbVar19 = pbVar21;
              uVar15 = 0;
            }
LAB_00261431:
            lVar16 = lVar16 + uVar15;
            pFVar14->y = lVar16;
            *pbVar24 = bVar2 & 1;
            iVar23 = 0;
            pbVar21 = pbVar19;
          }
          else {
            pbVar19 = pbVar21 + 1;
            iVar23 = 3;
            if (pbVar19 <= pbVar5) {
              uVar15 = -(ulong)*pbVar21;
              if ((bVar2 & 0x20) != 0) {
                uVar15 = (ulong)*pbVar21;
              }
              goto LAB_00261431;
            }
          }
LAB_00261445:
          if (iVar23 != 0) {
joined_r0x00261479:
            if (iVar23 == 3) {
              return 0x14;
            }
            return FVar26;
          }
          pFVar14 = pFVar14 + 1;
          pbVar24 = pbVar24 + 1;
        } while (pFVar14 < pFVar25);
      }
      (loader->current).outline.n_points = (short)uVar20;
      (loader->current).outline.n_contours = sVar4;
      load->cursor = pbVar21;
      return FVar26;
    }
  }
  return 0x14;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Simple_Glyph( TT_Loader  load )
  {
    FT_Error        error;
    FT_Byte*        p          = load->cursor;
    FT_Byte*        limit      = load->limit;
    FT_GlyphLoader  gloader    = load->gloader;
    FT_Int          n_contours = load->n_contours;
    FT_Outline*     outline;
    FT_UShort       n_ins;
    FT_Int          n_points;

    FT_Byte         *flag, *flag_limit;
    FT_Byte         c, count;
    FT_Vector       *vec, *vec_limit;
    FT_Pos          x, y;
    FT_Short        *cont, *cont_limit, prev_cont;
    FT_Int          xy_size = 0;


    /* check that we can add the contours to the glyph */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, 0, n_contours );
    if ( error )
      goto Fail;

    /* reading the contours' endpoints & number of points */
    cont       = gloader->current.outline.contours;
    cont_limit = cont + n_contours;

    /* check space for contours array + instructions count */
    if ( n_contours >= 0xFFF || p + ( n_contours + 1 ) * 2 > limit )
      goto Invalid_Outline;

    prev_cont = FT_NEXT_SHORT( p );

    if ( n_contours > 0 )
      cont[0] = prev_cont;

    if ( prev_cont < 0 )
      goto Invalid_Outline;

    for ( cont++; cont < cont_limit; cont++ )
    {
      cont[0] = FT_NEXT_SHORT( p );
      if ( cont[0] <= prev_cont )
      {
        /* unordered contours: this is invalid */
        goto Invalid_Outline;
      }
      prev_cont = cont[0];
    }

    n_points = 0;
    if ( n_contours > 0 )
    {
      n_points = cont[-1] + 1;
      if ( n_points < 0 )
        goto Invalid_Outline;
    }

    FT_TRACE5(( "  # of points: %d\n", n_points ));

    /* note that we will add four phantom points later */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, n_points + 4, 0 );
    if ( error )
      goto Fail;

    /* reading the bytecode instructions */
    load->glyph->control_len  = 0;
    load->glyph->control_data = NULL;

    if ( p + 2 > limit )
      goto Invalid_Outline;

    n_ins = FT_NEXT_USHORT( p );

    FT_TRACE5(( "  Instructions size: %u\n", n_ins ));

#ifdef TT_USE_BYTECODE_INTERPRETER

    if ( IS_HINTED( load->load_flags ) )
    {
      FT_ULong  tmp;


      /* check instructions size */
      if ( ( limit - p ) < n_ins )
      {
        FT_TRACE1(( "TT_Load_Simple_Glyph: instruction count mismatch\n" ));
        error = FT_THROW( Too_Many_Hints );
        goto Fail;
      }

      /* we don't trust `maxSizeOfInstructions' in the `maxp' table */
      /* and thus update the bytecode array size by ourselves       */

      tmp   = load->exec->glyphSize;
      error = Update_Max( load->exec->memory,
                          &tmp,
                          sizeof ( FT_Byte ),
                          (void*)&load->exec->glyphIns,
                          n_ins );

      load->exec->glyphSize = (FT_UInt)tmp;
      if ( error )
        return error;

      load->glyph->control_len  = n_ins;
      load->glyph->control_data = load->exec->glyphIns;

      if ( n_ins )
        FT_MEM_COPY( load->exec->glyphIns, p, (FT_Long)n_ins );
    }

#endif /* TT_USE_BYTECODE_INTERPRETER */

    p += n_ins;

    outline = &gloader->current.outline;

    /* reading the point tags */
    flag       = (FT_Byte*)outline->tags;
    flag_limit = flag + n_points;

    FT_ASSERT( flag );

    while ( flag < flag_limit )
    {
      if ( p + 1 > limit )
        goto Invalid_Outline;

      *flag++ = c = FT_NEXT_BYTE( p );
      if ( c & REPEAT_FLAG )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        count = FT_NEXT_BYTE( p );
        if ( flag + (FT_Int)count > flag_limit )
          goto Invalid_Outline;

        for ( ; count > 0; count-- )
          *flag++ = c;
      }
    }

    /* retain the overlap flag */
    if ( n_points && outline->tags[0] & OVERLAP_SIMPLE )
      gloader->base.outline.flags |= FT_OUTLINE_OVERLAP;

    /* reading the X coordinates */

    vec       = outline->points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    if ( p + xy_size > limit )
      goto Invalid_Outline;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   delta = 0;
      FT_Byte  f     = *flag;


      if ( f & X_SHORT_VECTOR )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_BYTE( p );
        if ( !( f & X_POSITIVE ) )
          delta = -delta;
      }
      else if ( !( f & SAME_X ) )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += delta;
      vec->x = x;
    }

    /* reading the Y coordinates */

    vec       = gloader->current.outline.points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    y         = 0;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   delta = 0;
      FT_Byte  f     = *flag;


      if ( f & Y_SHORT_VECTOR )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_BYTE( p );
        if ( !( f & Y_POSITIVE ) )
          delta = -delta;
      }
      else if ( !( f & SAME_Y ) )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_SHORT( p );
      }

      y     += delta;
      vec->y = y;

      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & ON_CURVE_POINT );
    }

    outline->n_points   = (FT_Short)n_points;
    outline->n_contours = (FT_Short)n_contours;

    load->cursor = p;

  Fail:
    return error;

  Invalid_Outline:
    error = FT_THROW( Invalid_Outline );
    goto Fail;
  }